

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.cc
# Opt level: O2

Enum * __thiscall
google::protobuf::util::converter::anon_unknown_0::TypeInfoForTypeResolver::GetEnumByTypeUrl
          (TypeInfoForTypeResolver *this,StringPiece type_url)

{
  iterator iVar1;
  Enum *pEVar2;
  Enum **ppEVar3;
  mapped_type *this_00;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  undefined1 local_a8 [8];
  StringPiece type_url_local;
  Status status;
  undefined1 local_60 [8];
  StatusOrEnum result;
  unique_ptr<google::protobuf::Enum,_std::default_delete<google::protobuf::Enum>_> enum_type;
  
  type_url_local.ptr_ = (char *)type_url.length_;
  local_a8 = (undefined1  [8])type_url.ptr_;
  iVar1 = std::
          _Rb_tree<google::protobuf::StringPiece,_std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>,_std::_Select1st<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>_>
          ::find(&(this->cached_enums_)._M_t,(key_type *)local_a8);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->cached_enums_)._M_t._M_impl.super__Rb_tree_header)
  {
    StringPiece::ToString_abi_cxx11_((string *)local_60,(StringPiece *)local_a8);
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->string_storage_,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    pEVar2 = (Enum *)operator_new(0x58);
    Enum::Enum(pEVar2);
    result.value_ = pEVar2;
    (*this->type_resolver_->_vptr_TypeResolver[3])
              (&type_url_local.length_,this->type_resolver_,pVar4.first._M_node._M_node + 1,pEVar2);
    pEVar2 = result.value_;
    if ((int)type_url_local.length_ == 0) {
      result.value_ = (Enum *)0x0;
      status.error_message_.field_2._8_8_ = pEVar2;
      StatusOr<const_google::protobuf::Enum_*>::StatusOr
                ((StatusOr<const_google::protobuf::Enum_*> *)local_60,
                 (Enum **)((long)&status.error_message_.field_2 + 8));
    }
    else {
      StatusOr<const_google::protobuf::Enum_*>::StatusOr
                ((StatusOr<const_google::protobuf::Enum_*> *)local_60,
                 (Status *)&type_url_local.length_);
    }
    StringPiece::StringPiece<std::allocator<char>>
              ((StringPiece *)((long)&status.error_message_.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (pVar4.first._M_node._M_node + 1));
    this_00 = std::
              map<google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>_>
              ::operator[](&this->cached_enums_,
                           (key_type *)((long)&status.error_message_.field_2 + 8));
    StatusOr<const_google::protobuf::Enum_*>::operator=
              (this_00,(StatusOr<const_google::protobuf::Enum_*> *)local_60);
    if (local_60._0_4_ == OK) {
      ppEVar3 = StatusOr<const_google::protobuf::Enum_*>::value
                          ((StatusOr<const_google::protobuf::Enum_*> *)local_60);
      pEVar2 = *ppEVar3;
    }
    else {
      pEVar2 = (Enum *)0x0;
    }
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&status);
    std::unique_ptr<google::protobuf::Enum,_std::default_delete<google::protobuf::Enum>_>::
    ~unique_ptr((unique_ptr<google::protobuf::Enum,_std::default_delete<google::protobuf::Enum>_> *)
                &result.value_);
  }
  else if (*(int *)&iVar1._M_node[1]._M_left == 0) {
    ppEVar3 = StatusOr<const_google::protobuf::Enum_*>::value
                        ((StatusOr<const_google::protobuf::Enum_*> *)&iVar1._M_node[1]._M_left);
    pEVar2 = *ppEVar3;
  }
  else {
    pEVar2 = (Enum *)0x0;
  }
  return pEVar2;
}

Assistant:

const google::protobuf::Enum* GetEnumByTypeUrl(
      StringPiece type_url) const override {
    std::map<StringPiece, StatusOrEnum>::iterator it =
        cached_enums_.find(type_url);
    if (it != cached_enums_.end()) {
      return it->second.ok() ? it->second.value() : NULL;
    }
    // Stores the string value so it can be referenced using StringPiece in the
    // cached_enums_ map.
    const std::string& string_type_url =
        *string_storage_.insert(std::string(type_url)).first;
    std::unique_ptr<google::protobuf::Enum> enum_type(
        new google::protobuf::Enum());
    util::Status status =
        type_resolver_->ResolveEnumType(string_type_url, enum_type.get());
    StatusOrEnum result =
        status.ok() ? StatusOrEnum(enum_type.release()) : StatusOrEnum(status);
    cached_enums_[string_type_url] = result;
    return result.ok() ? result.value() : NULL;
  }